

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

void list_remove(list *list,node *node)

{
  node *node_local;
  list *list_local;
  
  if (node->previous == (node *)0x0) {
    list->head = node->next;
  }
  else {
    node->previous->next = node->next;
  }
  if (node->next == (node *)0x0) {
    list->tail = node->previous;
  }
  else {
    node->next->previous = node->previous;
  }
  node->next = (node *)0x0;
  node->previous = (node *)0x0;
  list->size = list->size - 1;
  return;
}

Assistant:

void list_remove(struct list *list, struct node *node)
{
        if (node->previous == NULL) {
                // First element
                list->head = node->next;
        } else {
                node->previous->next = node->next;
        }

        if (node->next == NULL) {
                // Last element
                list->tail = node->previous;
        } else {
                node->next->previous = node->previous;
        }

        node->next = NULL;
        node->previous = NULL;

        --list->size;
}